

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseStartTag(htmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  startElementSAXFunc p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  xmlChar *str1;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlChar **ppxVar11;
  xmlChar **ppxVar12;
  char *msg;
  uint uVar13;
  long lVar14;
  int local_54;
  xmlChar *local_50;
  
  if (ctxt->input == (xmlParserInputPtr)0x0) {
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseStartTag: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else if ((ctxt->instate != XML_PARSER_EOF) && (*ctxt->input->cur == '<')) {
    xmlNextChar(ctxt);
    ppxVar12 = ctxt->atts;
    local_50._0_4_ = ctxt->maxatts;
    if ((ctxt->progressive == 0) &&
       (pxVar3 = ctxt->input, (long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserInputGrow(pxVar3,0xfa);
    }
    str1 = htmlParseHTMLName(ctxt);
    if (str1 != (xmlChar *)0x0) {
      iVar7 = xmlStrEqual(str1,(xmlChar *)"meta");
      htmlAutoClose(ctxt,str1);
      htmlCheckImplied(ctxt,str1);
      local_54 = 0;
      if ((0 < ctxt->nameNr) && (iVar8 = xmlStrEqual(str1,"html"), iVar8 != 0)) {
        htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <html> tag\n",str1,
                     (xmlChar *)0x0);
        ctxt->depth = ctxt->depth + 1;
        local_54 = 1;
      }
      if ((ctxt->nameNr != 1) && (iVar8 = xmlStrEqual(str1,"head"), iVar8 != 0)) {
        htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <head> tag\n",str1,
                     (xmlChar *)0x0);
        ctxt->depth = ctxt->depth + 1;
        local_54 = 1;
      }
      iVar8 = xmlStrEqual(str1,"body");
      if ((iVar8 != 0) && (0 < ctxt->nameNr)) {
        lVar14 = 0;
        do {
          iVar8 = xmlStrEqual(ctxt->nameTab[lVar14],"body");
          if (iVar8 != 0) {
            htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"htmlParseStartTag: misplaced <body> tag\n",
                         str1,(xmlChar *)0x0);
            ctxt->depth = ctxt->depth + 1;
            local_54 = 1;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < ctxt->nameNr);
      }
      uVar13 = 0;
      do {
LAB_0014bae8:
        do {
          htmlSkipBlankChars(ctxt);
          pxVar3 = ctxt->input;
          pxVar9 = pxVar3->cur;
          xVar1 = *pxVar9;
          if (xVar1 == '/') {
            xVar1 = pxVar9[1];
          }
          else if (xVar1 == '\0') goto LAB_0014be1e;
          if (xVar1 == '>') {
LAB_0014be1e:
            if (((iVar7 != 0) && (uVar13 != 0)) && (ppxVar12 != (xmlChar **)0x0)) {
              pxVar9 = *ppxVar12;
              bVar6 = false;
              if (pxVar9 == (xmlChar *)0x0) {
                local_50 = (xmlChar *)0x0;
              }
              else {
                bVar6 = false;
                local_50 = (xmlChar *)0x0;
                ppxVar11 = ppxVar12;
                do {
                  pxVar10 = ppxVar11[1];
                  if (pxVar10 != (xmlChar *)0x0) {
                    iVar7 = xmlStrcasecmp(pxVar9,(xmlChar *)"http-equiv");
                    if ((iVar7 == 0) &&
                       (iVar7 = xmlStrcasecmp(pxVar10,(xmlChar *)"Content-Type"), iVar7 == 0)) {
                      bVar6 = true;
                    }
                    else {
                      iVar7 = xmlStrcasecmp(pxVar9,"charset");
                      if (iVar7 == 0) {
                        htmlCheckEncodingDirect(ctxt,pxVar10);
                      }
                      else {
                        iVar7 = xmlStrcasecmp(pxVar9,"content");
                        if (iVar7 == 0) {
                          local_50 = pxVar10;
                        }
                      }
                    }
                  }
                  pxVar9 = ppxVar11[2];
                  ppxVar11 = ppxVar11 + 2;
                } while (pxVar9 != (xmlChar *)0x0);
              }
              if ((bVar6) && (local_50 != (xmlChar *)0x0)) {
                htmlCheckEncoding(ctxt,local_50);
              }
            }
            if (local_54 == 0) {
              htmlnamePush(ctxt,str1);
              if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                 (p_Var5 = ctxt->sax->startElement, p_Var5 != (startElementSAXFunc)0x0)) {
                ppxVar11 = (xmlChar **)0x0;
                if (uVar13 != 0) {
                  ppxVar11 = ppxVar12;
                }
                (*p_Var5)(ctxt->userData,str1,ppxVar11);
              }
            }
            if (uVar13 == 0 || ppxVar12 == (xmlChar **)0x0) {
              return local_54;
            }
            lVar14 = 1;
            do {
              if (ppxVar12[lVar14] != (xmlChar *)0x0) {
                (*xmlFree)(ppxVar12[lVar14]);
              }
              lVar14 = lVar14 + 2;
            } while ((int)lVar14 < (int)uVar13);
            return local_54;
          }
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar9 < 0xfa)) {
            xmlParserInputGrow(pxVar3,0xfa);
          }
          pxVar9 = htmlParseHTMLName(ctxt);
          if (pxVar9 == (xmlChar *)0x0) {
            htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"error parsing attribute name\n",(xmlChar *)0x0,
                         (xmlChar *)0x0);
            pxVar10 = (xmlChar *)0x0;
            pxVar9 = (xmlChar *)0x0;
          }
          else {
            htmlSkipBlankChars(ctxt);
            if (*ctxt->input->cur == '=') {
              xmlNextChar(ctxt);
              htmlSkipBlankChars(ctxt);
              xVar1 = *ctxt->input->cur;
              if (xVar1 == '\'') {
                xmlNextChar(ctxt);
                pxVar10 = htmlParseHTMLAttribute(ctxt,'\'');
                if (*ctxt->input->cur == '\'') {
LAB_0014bc06:
                  xmlNextChar(ctxt);
                  goto LAB_0014bc58;
                }
                msg = "AttValue: \' expected\n";
              }
              else {
                if (xVar1 != '\"') {
                  pxVar10 = htmlParseHTMLAttribute(ctxt,'\0');
                  if (pxVar10 != (xmlChar *)0x0) goto LAB_0014bc58;
                  htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_WITHOUT_VALUE,"AttValue: no value found\n",
                               (xmlChar *)0x0,(xmlChar *)0x0);
                  goto LAB_0014bc55;
                }
                xmlNextChar(ctxt);
                pxVar10 = htmlParseHTMLAttribute(ctxt,'\"');
                if (*ctxt->input->cur == '\"') goto LAB_0014bc06;
                msg = "AttValue: \" expected\n";
              }
              htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,msg,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            else {
LAB_0014bc55:
              pxVar10 = (xmlChar *)0x0;
            }
          }
LAB_0014bc58:
          if (pxVar9 == (xmlChar *)0x0) {
            if (pxVar10 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar10);
            }
            while( true ) {
              pbVar4 = ctxt->input->cur;
              bVar2 = *pbVar4;
              if (((bVar2 & 0xdf) == 0) || ((byte)(bVar2 - 9) < 2)) break;
              if (bVar2 == 0x2f) {
                bVar2 = pbVar4[1];
              }
              else if (bVar2 == 0xd) break;
              if (bVar2 == 0x3e) break;
              xmlNextChar(ctxt);
            }
            goto LAB_0014bae8;
          }
          if (uVar13 != 0) {
            lVar14 = 0;
            do {
              iVar8 = xmlStrEqual(ppxVar12[lVar14],pxVar9);
              if (iVar8 != 0) {
                htmlParseErr(ctxt,XML_ERR_ATTRIBUTE_REDEFINED,"Attribute %s redefined\n",pxVar9,
                             (xmlChar *)0x0);
                if (pxVar10 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar10);
                }
                goto LAB_0014bae8;
              }
              lVar14 = lVar14 + 2;
            } while ((int)lVar14 < (int)uVar13);
          }
          if (ppxVar12 == (xmlChar **)0x0) {
            ppxVar12 = (xmlChar **)(*xmlMalloc)(0xb0);
            if (ppxVar12 != (xmlChar **)0x0) {
              ctxt->atts = ppxVar12;
              ctxt->maxatts = 0x16;
              local_50._0_4_ = 0x16;
              goto LAB_0014be02;
            }
            htmlErrMemory(ctxt,(char *)0x0);
            local_50._0_4_ = 0x16;
            ppxVar12 = (xmlChar **)0x0;
            if (pxVar10 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar10);
              ppxVar12 = (xmlChar **)0x0;
            }
            goto LAB_0014bae8;
          }
          if ((int)(uVar13 + 4) <= (int)local_50) goto LAB_0014be02;
          local_50._0_4_ = (int)local_50 * 2;
          ppxVar11 = (xmlChar **)(*xmlRealloc)(ppxVar12,(long)(int)local_50 << 3);
          if (ppxVar11 == (xmlChar **)0x0) {
            htmlErrMemory(ctxt,(char *)0x0);
            iVar8 = 0xc;
            if (pxVar10 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar10);
            }
          }
          else {
            ctxt->atts = ppxVar11;
            ctxt->maxatts = (int)local_50;
            iVar8 = 0;
            ppxVar12 = ppxVar11;
          }
        } while (iVar8 == 0xc);
        if (iVar8 != 0) {
          return uVar13;
        }
LAB_0014be02:
        ppxVar12[uVar13] = pxVar9;
        ppxVar12[(ulong)uVar13 + 1] = pxVar10;
        ppxVar12[(ulong)uVar13 + 2] = (xmlChar *)0x0;
        (ppxVar12 + (ulong)uVar13 + 2)[1] = (xmlChar *)0x0;
        uVar13 = uVar13 + 2;
      } while( true );
    }
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    if (ctxt->recovery != 0) {
      bVar2 = *ctxt->input->cur;
      if ((((ulong)bVar2 < 0x3f) && ((0x7000000100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
         ((byte)(bVar2 - 0x30) < 10)) {
        htmlParseCharDataInternal(ctxt,0x3c);
        return -1;
      }
    }
    while (((xVar1 = *ctxt->input->cur, xVar1 != '\0' && (xVar1 != '>')) &&
           (ctxt->instate != XML_PARSER_EOF))) {
      xmlNextChar(ctxt);
    }
  }
  return -1;
}

Assistant:

static int
htmlParseStartTag(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts;
    int nbatts = 0;
    int maxatts;
    int meta = 0;
    int i;
    int discardtag = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseStartTag: context error\n", NULL, NULL);
	return -1;
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (CUR != '<') return -1;
    NEXT;

    atts = ctxt->atts;
    maxatts = ctxt->maxatts;

    GROW;
    name = htmlParseHTMLName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseStartTag: invalid element name\n",
		     NULL, NULL);
	/* if recover preserve text on classic misconstructs */
	if ((ctxt->recovery) && ((IS_BLANK_CH(CUR)) || (CUR == '<') ||
	    (CUR == '=') || (CUR == '>') || (((CUR >= '0') && (CUR <= '9'))))) {
	    htmlParseCharDataInternal(ctxt, '<');
	    return(-1);
	}


	/* Dump the bogus tag like browsers do */
	while ((CUR != 0) && (CUR != '>') &&
               (ctxt->instate != XML_PARSER_EOF))
	    NEXT;
        return -1;
    }
    if (xmlStrEqual(name, BAD_CAST"meta"))
	meta = 1;

    /*
     * Check for auto-closure of HTML elements.
     */
    htmlAutoClose(ctxt, name);

    /*
     * Check for implied HTML elements.
     */
    htmlCheckImplied(ctxt, name);

    /*
     * Avoid html at any level > 0, head at any level != 1
     * or any attempt to recurse body
     */
    if ((ctxt->nameNr > 0) && (xmlStrEqual(name, BAD_CAST"html"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <html> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if ((ctxt->nameNr != 1) &&
	(xmlStrEqual(name, BAD_CAST"head"))) {
	htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
	             "htmlParseStartTag: misplaced <head> tag\n",
		     name, NULL);
	discardtag = 1;
	ctxt->depth++;
    }
    if (xmlStrEqual(name, BAD_CAST"body")) {
	int indx;
	for (indx = 0;indx < ctxt->nameNr;indx++) {
	    if (xmlStrEqual(ctxt->nameTab[indx], BAD_CAST"body")) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "htmlParseStartTag: misplaced <body> tag\n",
			     name, NULL);
		discardtag = 1;
		ctxt->depth++;
	    }
	}
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    while ((CUR != 0) &&
           (CUR != '>') &&
	   ((CUR != '/') || (NXT(1) != '>'))) {
	GROW;
	attname = htmlParseAttribute(ctxt, &attvalue);
        if (attname != NULL) {

	    /*
	     * Well formedness requires at most one declaration of an attribute
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    htmlParseErr(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
		                 "Attribute %s redefined\n", attname, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
	    }

	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    htmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	}
	else {
	    if (attvalue != NULL)
	        xmlFree(attvalue);
	    /* Dump the bogus attribute string up to the next blank or
	     * the end of the tag. */
	    while ((CUR != 0) &&
	           !(IS_BLANK_CH(CUR)) && (CUR != '>') &&
		   ((CUR != '/') || (NXT(1) != '>')))
		NEXT;
	}

failed:
	SKIP_BLANKS;
    }

    /*
     * Handle specific association to the META tag
     */
    if (meta && (nbatts != 0))
	htmlCheckMeta(ctxt, atts);

    /*
     * SAX: Start of Element !
     */
    if (!discardtag) {
	htmlnamePush(ctxt, name);
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL)) {
	    if (nbatts != 0)
		ctxt->sax->startElement(ctxt->userData, name, atts);
	    else
		ctxt->sax->startElement(ctxt->userData, name, NULL);
	}
    }

    if (atts != NULL) {
        for (i = 1;i < nbatts;i += 2) {
	    if (atts[i] != NULL)
		xmlFree((xmlChar *) atts[i]);
	}
    }

    return(discardtag);
}